

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_read_default(lys_module *module,void *node,char *value,yytokentype type)

{
  int iVar1;
  LY_ERR *pLVar2;
  
  if (type == TYPEDEF_KEYWORD) {
    iVar1 = yang_check_string(module,(char **)((long)node + 0x78),"default","typedef",value,
                              (lys_node *)0x0);
    return iVar1;
  }
  if (type == LEAF_KEYWORD) {
    iVar1 = yang_check_string(module,(char **)((long)node + 0xc0),"default","leaf",value,
                              (lys_node *)node);
    return iVar1;
  }
  free(value);
  pLVar2 = ly_errno_location();
  *pLVar2 = LY_EINT;
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
         ,0x1b1);
  return 1;
}

Assistant:

int
yang_read_default(struct lys_module *module, void *node, char *value, enum yytokentype type)
{
    int ret;

    switch (type) {
    case LEAF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaf *) node)->dflt, "default", "leaf", value, node);
        break;
    case TYPEDEF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_tpdf *) node)->dflt, "default", "typedef", value, NULL);
        break;
    default:
        free(value);
        LOGINT;
        ret = EXIT_FAILURE;
        break;
    }
    return ret;
}